

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomizingToStringTests.cpp
# Opt level: O2

string * CustomToStringClass::toString<TemplatePrintable>
                   (string *__return_storage_ptr__,TemplatePrintable *printable)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,printable->field1_);
  std::operator+(__return_storage_ptr__,"From Template: ",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& printable)
    {
        return "From Template: " + std::to_string(printable.field1_);
    }